

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_round(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  IntrinsicResult *identifier;
  int32_t iVar1;
  long lVar2;
  ListStorage<MiniScript::Value> *pLVar3;
  double dVar4;
  double dVar5;
  Value local_a8;
  double local_98;
  double f;
  String local_80;
  undefined1 local_70 [24];
  long decimalPlaces;
  undefined1 local_38 [24];
  double num;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  num = (double)partialResult;
  partialResult_local = (IntrinsicResult *)context;
  context_local = (Context *)this;
  String::String((String *)&stack0xffffffffffffffb8,"x");
  Context::GetVar((Context *)local_38,(String *)context,
                  (LocalOnlyMode)(String *)&stack0xffffffffffffffb8);
  pLVar3 = (ListStorage<MiniScript::Value> *)Value::DoubleValue((Value *)local_38);
  Value::~Value((Value *)local_38);
  String::~String((String *)&stack0xffffffffffffffb8);
  identifier = partialResult_local;
  local_38._16_8_ = pLVar3;
  String::String(&local_80,"decimalPlaces");
  Context::GetVar((Context *)local_70,(String *)identifier,(LocalOnlyMode)&local_80);
  iVar1 = Value::IntValue((Value *)local_70);
  lVar2 = (long)iVar1;
  Value::~Value((Value *)local_70);
  String::~String(&local_80);
  local_70._16_8_ = lVar2;
  if (lVar2 == 0) {
    dVar4 = round((double)local_38._16_8_);
    Value::Value((Value *)&f,dVar4);
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,(Value *)&f,true);
    Value::~Value((Value *)&f);
  }
  else {
    dVar4 = pow(10.0,(double)lVar2);
    local_98 = dVar4;
    dVar5 = round((double)local_38._16_8_ * dVar4);
    Value::Value(&local_a8,dVar5 / dVar4);
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_a8,true);
    Value::~Value(&local_a8);
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_round(Context *context, IntrinsicResult partialResult) {
		double num = context->GetVar("x").DoubleValue();
		long decimalPlaces = context->GetVar("decimalPlaces").IntValue();
		if (decimalPlaces == 0) return IntrinsicResult(round(num));	// easy case
		double f = pow(10, decimalPlaces);
		return IntrinsicResult(round(num*f) / f);
	}